

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O3

void __thiscall
QtMWidgets::MsgBoxButton::MsgBoxButton(MsgBoxButton *this,QString *text,QWidget *parent)

{
  Data *pDVar1;
  MsgBoxButtonPrivate *this_00;
  undefined4 *puVar2;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  QObject local_38 [8];
  QObject local_30 [8];
  
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_001926d8;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxButton_001928a0;
  this_00 = (MsgBoxButtonPrivate *)operator_new(0x28);
  this_00->q = this;
  pDVar1 = (text->d).d;
  (this_00->text).d.d = pDVar1;
  (this_00->text).d.ptr = (text->d).ptr;
  (this_00->text).d.size = (text->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00->pressed = false;
  (this->d).d = this_00;
  MsgBoxButtonPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  local_48 = QAbstractButton::pressed;
  local_40 = 0;
  local_58 = _q_pressed;
  local_50 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::MsgBoxButton::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_pressed;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_48 = QAbstractButton::released;
  local_40 = 0;
  local_58 = _q_released;
  local_50 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::MsgBoxButton::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_released;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

MsgBoxButton::MsgBoxButton( const QString & text, QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new MsgBoxButtonPrivate( text, this ) )
{
	d->init();

	connect( this, &QAbstractButton::pressed,
		this, &MsgBoxButton::_q_pressed );

	connect( this, &QAbstractButton::released,
		this, &MsgBoxButton::_q_released );
}